

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O0

void __thiscall QPDFJob::UnderOverlay::~UnderOverlay(UnderOverlay *this)

{
  UnderOverlay *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->repeat_pagenos);
  std::vector<int,_std::allocator<int>_>::~vector(&this->from_pagenos);
  std::vector<int,_std::allocator<int>_>::~vector(&this->to_pagenos);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&this->pdf);
  std::__cxx11::string::~string((string *)&this->repeat_nr);
  std::__cxx11::string::~string((string *)&this->from_nr);
  std::__cxx11::string::~string((string *)&this->to_nr);
  std::shared_ptr<char>::~shared_ptr(&this->password);
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

UnderOverlay(char const* which) :
            which(which),
            to_nr("1-z"),
            from_nr("1-z"),
            repeat_nr("")
        {
        }